

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I422AlphaToARGBRow_AVX2
               (uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *a_buf,uint8_t *dst_argb,
               YuvConstants *yuvconstants,int width)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  auVar3 = *(undefined1 (*) [32])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [32])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [32])yuvconstants->kUVToR;
  auVar6 = *(undefined1 (*) [32])yuvconstants->kUVBiasB;
  auVar7 = *(undefined1 (*) [32])yuvconstants->kUVBiasG;
  auVar8 = *(undefined1 (*) [32])yuvconstants->kUVBiasR;
  auVar9 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  lVar15 = (long)v_buf - (long)u_buf;
  do {
    uVar2 = *(ulong *)u_buf;
    puVar1 = (ulong *)((long)u_buf + lVar15);
    u_buf = (uint8_t *)((long)u_buf + 8);
    auVar16 = vpunpcklbw_avx2(ZEXT832(uVar2),ZEXT832(*puVar1));
    auVar16 = vpermq_avx2(auVar16,0xd8);
    auVar18 = vpunpcklwd_avx2(auVar16,auVar16);
    auVar16 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])y_buf),0xd8);
    auVar12 = vpunpcklbw_avx2(auVar16,auVar16);
    y_buf = (uint8_t *)((long)y_buf + 0x10);
    auVar13 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])a_buf),0xd8);
    a_buf = (uint8_t *)((long)a_buf + 0x10);
    auVar16 = vpmaddubsw_avx2(auVar18,auVar5);
    auVar17 = vpmaddubsw_avx2(auVar18,auVar4);
    auVar18 = vpmaddubsw_avx2(auVar18,auVar3);
    auVar11 = vpsubw_avx2(auVar8,auVar16);
    auVar17 = vpsubw_avx2(auVar7,auVar17);
    auVar16 = vpsubw_avx2(auVar6,auVar18);
    auVar18 = vpmulhuw_avx2(auVar9,auVar12);
    auVar16 = vpaddsw_avx2(auVar16,auVar18);
    auVar17 = vpaddsw_avx2(auVar17,auVar18);
    auVar18 = vpaddsw_avx2(auVar11,auVar18);
    auVar16 = vpsraw_avx2(auVar16,6);
    auVar17 = vpsraw_avx2(auVar17,6);
    auVar18 = vpsraw_avx2(auVar18,6);
    auVar16 = vpackuswb_avx2(auVar16,auVar16);
    auVar17 = vpackuswb_avx2(auVar17,auVar17);
    auVar18 = vpackuswb_avx2(auVar18,auVar18);
    auVar16 = vpunpcklbw_avx2(auVar16,auVar17);
    auVar11 = vpermq_avx2(auVar16,0xd8);
    auVar16 = vpunpcklbw_avx2(auVar18,auVar13);
    auVar16 = vpermq_avx2(auVar16,0xd8);
    auVar17 = vpunpcklwd_avx2(auVar11,auVar16);
    auVar16 = vpunpckhwd_avx2(auVar11,auVar16);
    *(undefined1 (*) [32])dst_argb = auVar17;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar16;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar14 = width + -0x10;
    bVar10 = 0xf < width;
    width = iVar14;
  } while (iVar14 != 0 && bVar10);
  return;
}

Assistant:

void OMITFP I422AlphaToARGBRow_AVX2(const uint8_t* y_buf,
                                    const uint8_t* u_buf,
                                    const uint8_t* v_buf,
                                    const uint8_t* a_buf,
                                    uint8_t* dst_argb,
                                    const struct YuvConstants* yuvconstants,
                                    int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP_AVX2(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"

    LABELALIGN
      "1:                                        \n"
    READYUVA422_AVX2
    YUVTORGB_AVX2(yuvconstants)
    STOREARGB_AVX2
      "subl        $0x10,%[width]                \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [a_buf]"+r"(a_buf),    // %[a_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
#if defined(__i386__)
    [width]"+m"(width)     // %[width]
#else
    [width]"+rm"(width)    // %[width]
#endif
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS_AVX2
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}